

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

Block * __thiscall SQCompilation::SQParser::parseStatements(SQParser *this)

{
  Arena *this_00;
  Block *this_01;
  long lVar1;
  uint uVar2;
  Chunk *pCVar3;
  Statement *stmt;
  
  uVar2 = this->_depth;
  if (500 < uVar2) {
    reportDiagnostic(this,0x1d);
    uVar2 = this->_depth;
  }
  this->_depth = uVar2 + 1;
  this_00 = this->_astArena;
  pCVar3 = Arena::findChunk(this_00,0x38);
  this_01 = (Block *)pCVar3->_ptr;
  pCVar3->_ptr = (uint8_t *)(this_01 + 1);
  *(undefined4 *)&this_01->field_0x18 = 0;
  *(undefined4 *)&this_01->field_0x8 = 0xffffffff;
  *(undefined4 *)&this_01->field_0xc = 0xffffffff;
  *(undefined4 *)&this_01->field_0x10 = 0xffffffff;
  *(undefined4 *)&this_01->field_0x14 = 0xffffffff;
  *(undefined ***)this_01 = &PTR__ArenaObj_001a27d8;
  this_01->_is_root = false;
  this_01->_is_body = false;
  (this_01->_statements)._arena = this_00;
  (this_01->_statements)._vals = (Statement **)0x0;
  (this_01->_statements)._size = 0;
  (this_01->_statements)._allocated = 0;
  while ((1 < this->_token - 300U && (this->_token != 0x7d))) {
    stmt = parseStatement(this,false);
    Block::addStatement(this_01,stmt);
    lVar1 = (this->_lex)._prevtoken;
    if ((lVar1 != 0x3b) && (lVar1 != 0x7d)) {
      OptionalSemicolon(this);
    }
  }
  this->_depth = this->_depth - 1;
  return this_01;
}

Assistant:

Block* SQParser::parseStatements()
{
    NestingChecker nc(this);
    Block *result = newNode<Block>(arena());
    while(_token != _SC('}') && _token != TK_DEFAULT && _token != TK_CASE) {
        Statement *stmt = parseStatement();
        result->addStatement(stmt);
        if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
    }
    return result;
}